

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O2

void dirSAVETRD(void)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined8 extraout_RDX;
  EStatus type;
  uint autostart;
  char *message;
  uint uVar7;
  aint val;
  uint local_a4;
  undefined4 local_a0;
  int length;
  string fnaamh;
  path fnaam;
  string local_50;
  
  if ((DeviceID == (char *)0x0) || (pass != 3)) {
    if (DeviceID == (char *)0x0) {
      Error("SAVETRD only allowed in real device emulation mode (See DEVICE)",(char *)0x0,PASS3);
    }
    SkipToEol(&lp);
    return;
  }
  length = -1;
  GetOutputFileName_abi_cxx11_(&fnaam,&lp);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fnaamh,"",(allocator<char> *)&local_50);
  bVar2 = anyComma(&lp);
  type = SUPPRESS;
  if (bVar2) {
    bVar2 = anyComma(&lp);
    if (bVar2) {
      local_a0 = 0;
      bVar2 = false;
    }
    else {
      cVar1 = *lp;
      local_a0 = (undefined4)CONCAT71((int7)((ulong)extraout_RDX >> 8),cVar1 == '|');
      if (cVar1 == '|') {
        lp = lp + 1;
        SkipBlanks(&lp);
LAB_0010deb6:
        bVar2 = false;
      }
      else {
        if (cVar1 != '&') goto LAB_0010deb6;
        lp = lp + 1;
        bVar2 = true;
        SkipBlanks(&lp);
      }
      GetDelimitedString_abi_cxx11_(&local_50,&lp);
      std::__cxx11::string::operator=((string *)&fnaamh,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    if (fnaamh._M_string_length == 0) {
      message = "[SAVETRD] No filename";
    }
    else {
      bVar3 = anyComma(&lp);
      if (bVar3) {
        iVar4 = ParseExpressionNoSyntaxError(&lp,&val);
        uVar7 = val;
        if (0xffff < (uint)val) {
          uVar7 = 0xffffffff;
        }
        bVar3 = anyComma(&lp);
        if (bVar3) {
          ParseExpressionNoSyntaxError(&lp,&length);
          bVar3 = anyComma(&lp);
          autostart = 0xffffffff;
          iVar5 = -1;
          if (!bVar3) {
LAB_0010dfbe:
            TRD_AddFile(&fnaam,fnaamh._M_dataplus._M_p,-(uint)(iVar4 == 0) | uVar7,length,autostart,
                        local_a0._0_1_,bVar2,iVar5);
            goto LAB_0010df98;
          }
          type = PASS3;
          if (bVar2 == false) {
            iVar5 = ParseExpression(&lp,&val);
            message = "[SAVETRD] Syntax error";
            if (iVar5 != 0) {
              local_a4 = val;
              if (val < 0) {
                message = "[SAVETRD] Negative values are not allowed";
              }
              else {
                bVar3 = anyComma(&lp);
                autostart = local_a4;
                iVar5 = -1;
                if ((!bVar3) ||
                   (iVar6 = ParseExpression(&lp,&val), autostart = local_a4, iVar5 = val, iVar6 != 0
                   )) goto LAB_0010dfbe;
              }
            }
          }
          else {
            message = "[SAVETRD] Autostart is not used here";
          }
        }
        else {
          message = "[SAVETRD] Syntax error. No length";
        }
      }
      else {
        message = "[SAVETRD] Syntax error. No address";
      }
    }
  }
  else {
    message = "[SAVETRD] Syntax error. No parameters";
  }
  Error(message,bp,type);
LAB_0010df98:
  std::__cxx11::string::~string((string *)&fnaamh);
  std::filesystem::__cxx11::path::~path(&fnaam);
  return;
}

Assistant:

static void dirSAVETRD() {
	if (!DeviceID || pass != LASTPASS) {
		if (!DeviceID) Error("SAVETRD only allowed in real device emulation mode (See DEVICE)");
		SkipToEol(lp);
		return;
	}

	bool exec = true, replace = false, addplace = false;
	aint val;
	int start = -1, length = -1, autostart = -1, lengthMinusVars = -1;

	const std::filesystem::path fnaam = GetOutputFileName(lp);

	std::string fnaamh {""};
	if (!anyComma(lp)) return Error("[SAVETRD] Syntax error. No parameters", bp, SUPPRESS);
	if (!anyComma(lp)) {
		if ((replace = ('|' == *lp))) SkipBlanks(++lp);	// detect "|" for "replace" feature
		else if ((addplace = ('&' == *lp))) SkipBlanks(++lp); // detect "&" for "addplace" feature
		fnaamh = GetDelimitedString(lp);
	}
	if (fnaamh.empty()) return Error("[SAVETRD] No filename", bp, SUPPRESS);

	if (!anyComma(lp)) return Error("[SAVETRD] Syntax error. No address", bp, SUPPRESS);
	if (ParseExpressionNoSyntaxError(lp, val) && 0 <= val && val <= 0xFFFF) {
		start = val;
	}	// else start == -1 (syntax error or invalid value)
	if (!anyComma(lp)) return Error("[SAVETRD] Syntax error. No length", bp, SUPPRESS);
	ParseExpressionNoSyntaxError(lp, length);	// parse error/invalid value will be reported later

	if (anyComma(lp)) {
		if (addplace) {
			Error("[SAVETRD] Autostart is not used here", bp, PASS3); return;
		} else {
			if (!ParseExpression(lp, val)) {
				Error("[SAVETRD] Syntax error", bp, PASS3); return;
			}
			if (val < 0) {
				Error("[SAVETRD] Negative values are not allowed", bp, PASS3); return;
			}
			autostart = val;
			// optional length of BASIC without variables
			if (anyComma(lp)) {
				if (!ParseExpression(lp, val)) {
					Error("[SAVETRD] Syntax error", bp, PASS3); return;
				}
				lengthMinusVars = val;
			}
		}
	}

	if (exec) TRD_AddFile(fnaam, fnaamh.c_str(), start, length, autostart, replace, addplace, lengthMinusVars);
}